

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

Nullable<CordRep_*> absl::VerifyTree(Nullable<CordRep_*> node)

{
  bool local_11;
  Nullable<CordRep_*> node_local;
  
  local_11 = true;
  if (node != (Nullable<CordRep_*>)0x0) {
    local_11 = VerifyNode(node,node);
  }
  if (local_11 == false) {
    __assert_fail("node == nullptr || VerifyNode(node, node)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x55,"absl::Nullable<CordRep *> absl::VerifyTree(absl::Nullable<CordRep *>)");
  }
  return node;
}

Assistant:

static inline absl::Nullable<CordRep*> VerifyTree(
    absl::Nullable<CordRep*> node) {
  assert(node == nullptr || VerifyNode(node, node));
  static_cast<void>(&VerifyNode);
  return node;
}